

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

int __thiscall icu_63::FixedDecimal::init(FixedDecimal *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  UBool UVar2;
  byte bVar3;
  int iVar4;
  undefined7 extraout_var;
  long lVar5;
  ulong uVar6;
  long in_RDX;
  double in_XMM0_Qa;
  
  this->isNegative = in_XMM0_Qa < 0.0;
  this->source = ABS(in_XMM0_Qa);
  UVar2 = uprv_isNaN_63(ABS(in_XMM0_Qa));
  this->_isNaN = UVar2;
  bVar3 = uprv_isInfinite_63(this->source);
  this->_isInfinite = bVar3;
  bVar3 = bVar3 | this->_isNaN;
  iVar4 = (int)CONCAT71(extraout_var,bVar3);
  if (bVar3 == 0) {
    dVar1 = this->source;
    lVar5 = (long)dVar1;
    this->intValue = lVar5;
    iVar4 = (int)CONCAT71((int7)((ulong)lVar5 >> 8),!NAN((double)lVar5) && !NAN(dVar1));
    this->_hasIntegerValue = (double)lVar5 == dVar1;
    this->visibleDecimalDigitCount = (int32_t)ctx;
    this->decimalDigits = in_RDX;
    if (in_RDX == 0) {
      in_RDX = 0;
    }
    else {
      uVar6 = in_RDX * -0x3333333333333333 + 0x1999999999999998;
      for (uVar6 = uVar6 >> 1 | (ulong)((uVar6 & 1) != 0) << 0x3f; iVar4 = (int)uVar6,
          uVar6 < 0x1999999999999999; uVar6 = uVar6 >> 1 | (ulong)((uVar6 & 1) != 0) << 0x3f) {
        in_RDX = in_RDX / 10;
        uVar6 = in_RDX * -0x3333333333333333 + 0x1999999999999998;
      }
    }
  }
  else {
    in_RDX = 0;
    this->intValue = 0;
    this->_hasIntegerValue = '\0';
    this->visibleDecimalDigitCount = 0;
    this->decimalDigits = 0;
  }
  this->decimalDigitsWithoutTrailingZeros = in_RDX;
  return iVar4;
}

Assistant:

void FixedDecimal::init(double n, int32_t v, int64_t f) {
    isNegative = n < 0.0;
    source = fabs(n);
    _isNaN = uprv_isNaN(source);
    _isInfinite = uprv_isInfinite(source);
    if (_isNaN || _isInfinite) {
        v = 0;
        f = 0;
        intValue = 0;
        _hasIntegerValue = FALSE;
    } else {
        intValue = (int64_t)source;
        _hasIntegerValue = (source == intValue);
    }

    visibleDecimalDigitCount = v;
    decimalDigits = f;
    if (f == 0) {
         decimalDigitsWithoutTrailingZeros = 0;
    } else {
        int64_t fdwtz = f;
        while ((fdwtz%10) == 0) {
            fdwtz /= 10;
        }
        decimalDigitsWithoutTrailingZeros = fdwtz;
    }
}